

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void Luv32toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  int16_t iVar1;
  undefined2 *puVar2;
  double v;
  double u;
  int16_t *luv3;
  uint32_t *luv;
  tmsize_t n_local;
  uint8_t *op_local;
  LogLuvState *sp_local;
  
  luv3 = (int16_t *)sp->tbuf;
  u = (double)op;
  luv = (uint32_t *)n;
  while (0 < (long)luv) {
    *(int16_t *)u = luv3[1];
    iVar1 = *luv3;
    puVar2 = (undefined2 *)((long)u + 4);
    *(short *)((long)u + 2) =
         (short)(int)(((double)*(byte *)((long)luv3 + 1) + 0.5) * 0.0024390243902439024 * 32768.0);
    u = (double)((long)u + 6);
    *puVar2 = (short)(int)(((double)(byte)iVar1 + 0.5) * 0.0024390243902439024 * 32768.0);
    luv3 = luv3 + 2;
    luv = (uint32_t *)((long)luv + -1);
  }
  return;
}

Assistant:

static void Luv32toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)(*luv >> 16);
        u = 1. / UVSCALE * ((*luv >> 8 & 0xff) + .5);
        v = 1. / UVSCALE * ((*luv & 0xff) + .5);
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}